

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O2

bool __thiscall pg::PPSolver::setupRegion(PPSolver *this,int i,int p,bool mustReset)

{
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  bitset *pbVar4;
  size_t sVar5;
  uint64_t *puVar6;
  pointer piVar7;
  pointer piVar8;
  int *piVar9;
  const_iterator __first;
  int *piVar10;
  undefined7 in_register_00000009;
  const_iterator __last;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar15;
  int local_3c;
  long local_38;
  
  uVar12 = (ulong)(uint)i;
  lVar13 = (long)p;
  this_00 = this->regions + lVar13;
  if ((int)CONCAT71(in_register_00000009,mustReset) != 0) {
    piVar9 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __last._M_current =
         (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
LAB_00150fd9:
    if (piVar9 != __last._M_current) {
      resetRegion(this,p);
    }
    sVar5 = (this->Z)._bitssize;
    puVar6 = (this->Z)._bits;
    for (lVar11 = 0; sVar5 << 3 != lVar11; lVar11 = lVar11 + 8) {
      *(undefined8 *)((long)puVar6 + lVar11) = 0;
    }
    goto LAB_001510c8;
  }
  __last._M_current =
       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  pbVar4 = (this->super_Solver).disabled;
  piVar10 = this->region;
  puVar6 = (this->Z)._bits;
  piVar9 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (piVar15 = piVar9; local_38 = lVar13, piVar15 != __last._M_current; piVar15 = piVar15 + 1) {
    uVar14 = (ulong)*piVar15;
    uVar2 = piVar10[uVar14];
    if (uVar2 == p) {
      puVar1 = puVar6 + (uVar14 >> 6);
      *puVar1 = *puVar1 | 1L << (uVar14 & 0x3f);
    }
    else if ((((int)uVar2 < p) || ((1L << (uVar14 & 0x3f) & pbVar4->_bits[uVar14 >> 6]) != 0)) ||
            ((p < (int)uVar2 && (((uVar2 ^ p) & 1) != 0)))) goto LAB_00150fd9;
  }
  puVar6 = (this->Z)._bits;
  lVar11 = (long)__last._M_current - (long)piVar9;
  for (lVar13 = lVar11 >> 4; 0 < lVar13; lVar13 = lVar13 + -1) {
    __first._M_current = piVar9;
    if ((puVar6[(ulong)(long)*piVar9 >> 6] >> ((long)*piVar9 & 0x3fU) & 1) == 0) goto LAB_00151085;
    if ((puVar6[(ulong)(long)piVar9[1] >> 6] >> ((long)piVar9[1] & 0x3fU) & 1) == 0) {
      __first._M_current = piVar9 + 1;
      goto LAB_00151085;
    }
    if ((puVar6[(ulong)(long)piVar9[2] >> 6] >> ((long)piVar9[2] & 0x3fU) & 1) == 0) {
      __first._M_current = piVar9 + 2;
      goto LAB_00151085;
    }
    if ((puVar6[(ulong)(long)piVar9[3] >> 6] >> ((long)piVar9[3] & 0x3fU) & 1) == 0) {
      __first._M_current = piVar9 + 3;
      goto LAB_00151085;
    }
    piVar9 = piVar9 + 4;
    lVar11 = lVar11 + -0x10;
  }
  lVar11 = lVar11 >> 2;
  if (lVar11 == 1) {
LAB_0015105d:
    __first._M_current = piVar9;
    if ((puVar6[(ulong)(long)*piVar9 >> 6] >> ((long)*piVar9 & 0x3fU) & 1) != 0) {
      __first._M_current = __last._M_current;
    }
LAB_00151085:
    piVar9 = __first._M_current;
    if (__first._M_current != __last._M_current) {
      while (piVar10 = __first._M_current + 1, __first._M_current = piVar9,
            piVar10 != __last._M_current) {
        iVar3 = *piVar10;
        __first._M_current = piVar10;
        if ((puVar6[(ulong)(long)iVar3 >> 6] >> ((long)iVar3 & 0x3fU) & 1) != 0) {
          *piVar9 = iVar3;
          piVar9 = piVar9 + 1;
        }
      }
    }
  }
  else {
    if (lVar11 == 2) {
LAB_00151045:
      __first._M_current = piVar9;
      if ((puVar6[(ulong)(long)*piVar9 >> 6] >> ((long)*piVar9 & 0x3fU) & 1) != 0) {
        piVar9 = piVar9 + 1;
        goto LAB_0015105d;
      }
      goto LAB_00151085;
    }
    __first._M_current = __last._M_current;
    if (lVar11 == 3) {
      __first._M_current = piVar9;
      if ((puVar6[(ulong)(long)*piVar9 >> 6] >> ((long)*piVar9 & 0x3fU) & 1) != 0) {
        piVar9 = piVar9 + 1;
        goto LAB_00151045;
      }
      goto LAB_00151085;
    }
  }
  std::vector<int,_std::allocator<int>_>::erase(this_00,__first,__last);
  lVar13 = local_38;
LAB_001510c8:
  while ((local_3c = (int)uVar12, -1 < local_3c &&
         (((this->super_Solver).game)->_priority[uVar12] == p))) {
    iVar3 = this->region[uVar12];
    if (iVar3 != -2) {
      if ((((this->super_Solver).disabled)->_bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
        if (iVar3 == p) {
          puVar6 = (this->Z)._bits;
          if ((puVar6[uVar12 >> 6] & 1L << (uVar12 & 0x3f)) == 0) {
            std::vector<int,_std::allocator<int>_>::push_back(this->regions + lVar13,&local_3c);
            this->strategy[local_3c] = -1;
          }
          else {
            uVar14 = (ulong)this->strategy[uVar12];
            if ((uVar14 != 0xffffffffffffffff) &&
               ((puVar6[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0)) {
              this->strategy[uVar12] = -1;
            }
          }
        }
      }
      else {
        this->region[uVar12] = -2;
      }
    }
    uVar12 = (ulong)(local_3c - 1);
  }
  sVar5 = (this->Z)._bitssize;
  puVar6 = (this->Z)._bits;
  for (lVar11 = 0; sVar5 << 3 != lVar11; lVar11 = lVar11 + 8) {
    *(undefined8 *)((long)puVar6 + lVar11) = 0;
  }
  piVar7 = this->regions[lVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = this->regions[lVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar7 != piVar8) {
    attract(this,p);
  }
  return piVar7 != piVar8;
}

Assistant:

bool
PPSolver::setupRegion(int i, int p, bool mustReset)
{
    // NOTE: a node can be "disabled" and in a region (after dominion attraction)
    
    if (!mustReset) {
        // Check if we must reset anyway (because region is tainted)
        // When must a region be reset?
        // - some vertices are in a dominion (now disabled)
        // - some vertices are already reset (i.e., attracted by opponent, then reset)
        // - some vertices are attracted to a higher OPPONENT region
        // When does a region not need to be reset?
        // - some vertices are attracted to a higher SAME-PARITY region
        for (int i : regions[p]) {
            if (region[i] == p) {
                Z[i] = true;
            } else if (disabled[i] or region[i] < p or (region[i] > p and (region[i]&1) != (p&1))) {
                mustReset = true;
                break;
            }
        }
    }

    if (mustReset) {
        if (!regions[p].empty()) resetRegion(p);
        Z.reset();
    } else {
        // No reset, but remove escapes (to be added) and remove things in a higher region...
        // The reason is that there may be vertices of priority p that are not yet in the region vector
        regions[p].erase(std::remove_if(regions[p].begin(), regions[p].end(),
                [&](const int x){ return Z[x] != 1; }),
                regions[p].end());
    }

    // Add all escapes to regions vector
    for (int j=i; j>=0 && priority(j) == p; j--) {
        if (region[j] == -2) continue; // already known to be disabled
        else if (disabled[j]) region[j] = -2; // set now to region -2
        else if (region[j] == p) { // is [to be] in region!
            if (Z[j]) {
                // already in the region, but check strategy
                if (strategy[j] != -1 and !Z[strategy[j]]) strategy[j] = -1;
                continue;
            } else {
                regions[p].push_back(j);
                strategy[j] = -1;
            }
        }
    }

    Z.reset();

    // If the region is empty, return false
    if (regions[p].empty()) return false;

    // Otherwise, attract and return true
    attract(p);
    return true;
}